

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O3

void lodepng::convertFromXYZ_gamma
               (float *im,uint w,uint h,LodePNGInfo *info,uint use_icc,LodePNGICC *icc)

{
  float fVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  float *pfVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  
  uVar10 = (ulong)(w * h);
  if (use_icc == 0) {
    if ((info->gama_defined == 0) || (info->srgb_defined != 0)) {
      if (uVar10 != 0) {
        uVar8 = 0;
        do {
          lVar7 = 0;
          do {
            fVar12 = im[lVar7];
            if (0.0031308 <= fVar12) {
              fVar12 = lodepng_powf(fVar12,0.41666666);
              fVar12 = fVar12 * 1.055 + -0.055;
            }
            else {
              fVar12 = fVar12 * 12.92;
            }
            im[lVar7] = fVar12;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          uVar8 = uVar8 + 1;
          im = im + 4;
        } while (uVar8 != uVar10);
      }
    }
    else {
      uVar2 = info->gama_gamma;
      if ((uVar2 != 100000) && (uVar10 != 0)) {
        uVar8 = 0;
        do {
          lVar7 = 0;
          do {
            if (0.0 < im[lVar7]) {
              fVar12 = lodepng_powf(im[lVar7],(float)uVar2 / 100000.0);
              im[lVar7] = fVar12;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          uVar8 = uVar8 + 1;
          im = im + 4;
        } while (uVar8 != uVar10);
      }
    }
  }
  else if (uVar10 != 0) {
    uVar8 = 0;
    do {
      lVar7 = 0;
      do {
        uVar2 = icc->trc[lVar7].type;
        if (uVar2 < 7) {
          fVar11 = im[uVar8 * 4 + lVar7];
          fVar12 = fVar11;
          switch(uVar2) {
          case 1:
            if ((0.0 < fVar11) && (fVar11 < 1.0)) {
              uVar3 = icc->trc[lVar7].lut_size;
              if (uVar3 == 0) {
                pfVar6 = icc->trc[lVar7].lut;
                uVar4 = 0;
              }
              else {
                uVar5 = 0;
                do {
                  if (uVar5 + 1 == uVar3) {
                    pfVar6 = icc->trc[lVar7].lut;
                    fVar12 = pfVar6[uVar5];
                    fVar1 = pfVar6[uVar3];
                    if ((fVar12 != fVar1) || (NAN(fVar12) || NAN(fVar1))) {
                      fVar11 = (fVar11 - fVar12) / (fVar1 - fVar12);
                      fVar12 = fVar11 * fVar1 + (1.0 - fVar11) * fVar12;
                    }
                    goto switchD_0011d393_caseD_0;
                  }
                  uVar9 = uVar3 + uVar5 >> 1;
                  pfVar6 = icc->trc[lVar7].lut;
                  uVar4 = uVar9;
                  if (pfVar6[uVar9] <= fVar11) {
                    uVar4 = uVar3;
                    uVar5 = uVar9;
                  }
                  uVar3 = uVar4;
                } while (uVar5 != uVar4);
              }
              fVar12 = pfVar6[uVar4];
            }
            break;
          case 2:
            if (0.0 < fVar11) {
              fVar12 = lodepng_powf(fVar11,1.0 / icc->trc[lVar7].gamma);
            }
            break;
          case 3:
            if (0.0 <= fVar11) {
              if (0.0 < fVar11) goto LAB_0011d497;
LAB_0011d440:
              fVar12 = -icc->trc[lVar7].b;
              goto LAB_0011d4b5;
            }
            break;
          case 4:
            if (0.0 <= fVar11) {
              fVar12 = icc->trc[lVar7].c;
              if (fVar11 <= fVar12) goto LAB_0011d440;
              goto LAB_0011d493;
            }
            break;
          case 5:
            fVar12 = icc->trc[lVar7].c;
            if (icc->trc[lVar7].d * fVar12 < fVar11) goto LAB_0011d497;
LAB_0011d4c2:
            fVar12 = fVar11 / fVar12;
            break;
          case 6:
            fVar12 = icc->trc[lVar7].c;
            fVar1 = icc->trc[lVar7].f;
            if (fVar11 <= icc->trc[lVar7].d * fVar12 + fVar1) {
              fVar11 = fVar11 - fVar1;
              goto LAB_0011d4c2;
            }
LAB_0011d493:
            fVar11 = fVar11 - fVar12;
LAB_0011d497:
            fVar12 = lodepng_powf(fVar11,1.0 / icc->trc[lVar7].gamma);
            fVar12 = fVar12 - icc->trc[lVar7].b;
LAB_0011d4b5:
            fVar12 = fVar12 / icc->trc[lVar7].a;
          }
        }
        else {
          fVar12 = 0.0;
        }
switchD_0011d393_caseD_0:
        im[uVar8 * 4 + lVar7] = fVar12;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar10);
  }
  return;
}

Assistant:

static void convertFromXYZ_gamma(float* im, unsigned w, unsigned h,
                                 const LodePNGInfo* info, unsigned use_icc, const LodePNGICC* icc) {
  size_t i, c;
  size_t n = w * h;
  if(use_icc) {
    for(i = 0; i < n; i++) {
      for(c = 0; c < 3; c++) {
        /* TODO: this is likely very slow */
        im[i * 4 + c] = iccBackwardTRC(&icc->trc[c], im[i * 4 + c]);
      }
    }
  } else if(info->gama_defined && !info->srgb_defined) {
    /* nothing to do if gamma is 1 */
    if(info->gama_gamma != 100000) {
      float gamma = info->gama_gamma / 100000.0f;
      for(i = 0; i < n; i++) {
        for(c = 0; c < 3; c++) {
          if(im[i * 4 + c] > 0) im[i * 4 + c] = lodepng_powf(im[i * 4 + c], gamma);
        }
      }
    }
  } else {
    for(i = 0; i < n; i++) {
      for(c = 0; c < 3; c++) {
        /* sRGB gamma compress */
        float* v = &im[i * 4 + c];
        *v = (*v < 0.0031308f) ? (*v * 12.92f) : (1.055f * lodepng_powf(*v, 1 / 2.4f) - 0.055f);
      }
    }
  }
}